

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void PurgeWord2000Attributes(TidyDocImpl *doc,Node *node)

{
  AttVal *pAVar1;
  int iVar2;
  AttVal *local_30;
  AttVal *prev;
  AttVal *next;
  AttVal *attr;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  local_30 = (AttVal *)0x0;
  next = node->attributes;
  while (next != (AttVal *)0x0) {
    pAVar1 = next->next;
    if ((((next == (AttVal *)0x0) || (next->dict == (Attribute *)0x0)) ||
        (next->dict->id != TidyAttr_CLASS)) ||
       ((((next == (AttVal *)0x0 || (next->value == (tmbstr)0x0)) ||
         (iVar2 = prvTidytmbstrcasecmp(next->value,"Code"), iVar2 != 0)) &&
        (iVar2 = prvTidytmbstrncmp(next->value,"Mso",3), iVar2 == 0)))) {
      if (((((((next == (AttVal *)0x0) || (next->dict == (Attribute *)0x0)) ||
             (next->dict->id != TidyAttr_CLASS)) &&
            (((next == (AttVal *)0x0 || (next->dict == (Attribute *)0x0)) ||
             (next->dict->id != TidyAttr_STYLE)))) &&
           (((next == (AttVal *)0x0 || (next->dict == (Attribute *)0x0)) ||
            (next->dict->id != TidyAttr_LANG)))) &&
          (((((next == (AttVal *)0x0 || (next->dict == (Attribute *)0x0)) ||
             (next->dict->id != TidyAttr_HEIGHT)) &&
            (((next == (AttVal *)0x0 || (next->dict == (Attribute *)0x0)) ||
             (next->dict->id != TidyAttr_WIDTH)))) ||
           ((((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_TD))
            && ((((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) ||
                 (node->tag->id != TidyTag_TR)) &&
                (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) ||
                 (node->tag->id != TidyTag_TH)))))))))) &&
         ((next->attribute == (tmbstr)0x0 ||
          (iVar2 = prvTidytmbstrncmp(next->attribute,"x:",2), iVar2 != 0)))) {
        local_30 = next;
        next = pAVar1;
      }
      else {
        if (local_30 == (AttVal *)0x0) {
          node->attributes = pAVar1;
        }
        else {
          local_30->next = pAVar1;
        }
        prvTidyFreeAttribute(doc,next);
        next = pAVar1;
      }
    }
    else {
      local_30 = next;
      next = pAVar1;
    }
  }
  return;
}

Assistant:

static void PurgeWord2000Attributes( TidyDocImpl* doc, Node* node )
{
    AttVal *attr, *next, *prev = NULL;

    for ( attr = node->attributes; attr; attr = next )
    {
        next = attr->next;

        /* special check for class="Code" denoting pre text */
        /* Pass thru user defined styles as HTML class names */
        if (attrIsCLASS(attr))
        {
            if (AttrValueIs(attr, "Code") ||
                 TY_(tmbstrncmp)(attr->value, "Mso", 3) != 0 )
            {
                prev = attr;
                continue;
            }
        }

        if (attrIsCLASS(attr) ||
            attrIsSTYLE(attr) ||
            attrIsLANG(attr)  ||
             ( (attrIsHEIGHT(attr) || attrIsWIDTH(attr)) &&
               (nodeIsTD(node) || nodeIsTR(node) || nodeIsTH(node)) ) ||
             (attr->attribute && TY_(tmbstrncmp)(attr->attribute, "x:", 2) == 0) )
        {
            if (prev)
                prev->next = next;
            else
                node->attributes = next;

            TY_(FreeAttribute)( doc, attr );
        }
        else
            prev = attr;
    }
}